

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_scrollbar_behavior
                (nk_flags *state,nk_input *in,int has_scrolling,nk_rect *scroll,nk_rect *cursor,
                nk_rect *empty0,nk_rect *empty1,float scroll_offset,float target,float scroll_step,
                nk_orientation o)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float cursor_x;
  float cursor_y;
  float delta;
  float pixel;
  int left_mouse_click_in_cursor;
  int left_mouse_down;
  nk_flags ws;
  float scroll_step_local;
  float target_local;
  float scroll_offset_local;
  nk_rect *empty0_local;
  nk_rect *cursor_local;
  nk_rect *scroll_local;
  nk_input *pnStack_20;
  int has_scrolling_local;
  nk_input *in_local;
  nk_flags *state_local;
  
  if ((*state & 2) == 0) {
    *state = 4;
  }
  else {
    *state = 6;
  }
  state_local._4_4_ = scroll_offset;
  if (in != (nk_input *)0x0) {
    iVar4 = (in->mouse).buttons[0].down;
    left_mouse_down = (int)scroll_step;
    ws = (nk_flags)target;
    scroll_step_local = scroll_offset;
    _target_local = empty0;
    empty0_local = cursor;
    cursor_local = scroll;
    scroll_local._4_4_ = has_scrolling;
    pnStack_20 = in;
    in_local = (nk_input *)state;
    iVar2 = nk_input_has_mouse_click_down_in_rect(in,NK_BUTTON_LEFT,*cursor,1);
    iVar3 = nk_input_is_mouse_hovering_rect(pnStack_20,*cursor_local);
    if (iVar3 != 0) {
      (in_local->keyboard).keys[0].down = 0x12;
    }
    if ((iVar4 == 0) || (iVar2 == 0)) {
      iVar4 = nk_input_is_key_pressed(pnStack_20,NK_KEY_SCROLL_UP);
      if (((iVar4 == 0) || ((o != NK_VERTICAL || (scroll_local._4_4_ == 0)))) &&
         (iVar4 = nk_button_behavior((nk_flags *)&left_mouse_click_in_cursor,*_target_local,
                                     pnStack_20,NK_BUTTON_DEFAULT), iVar4 == 0)) {
        iVar4 = nk_input_is_key_pressed(pnStack_20,NK_KEY_SCROLL_DOWN);
        if ((((iVar4 == 0) || (o != NK_VERTICAL)) || (scroll_local._4_4_ == 0)) &&
           (iVar4 = nk_button_behavior((nk_flags *)&left_mouse_click_in_cursor,*empty1,pnStack_20,
                                       NK_BUTTON_DEFAULT), iVar4 == 0)) {
          if (scroll_local._4_4_ != 0) {
            pfVar1 = &(pnStack_20->mouse).scroll_delta;
            if ((*pfVar1 <= 0.0 && *pfVar1 != 0.0) || (0.0 < (pnStack_20->mouse).scroll_delta)) {
              local_a8 = (float)left_mouse_down * -(pnStack_20->mouse).scroll_delta +
                         scroll_step_local;
              if (o == NK_VERTICAL) {
                local_94 = local_a8;
                if ((float)ws - cursor_local->h <= local_a8) {
                  local_94 = (float)ws - cursor_local->h;
                }
                if (0.0 <= local_94) {
                  local_9c = local_a8;
                  if ((float)ws - cursor_local->h <= local_a8) {
                    local_9c = (float)ws - cursor_local->h;
                  }
                  local_98 = local_9c;
                }
                else {
                  local_98 = 0.0;
                }
                scroll_step_local = local_98;
              }
              else {
                local_a0 = local_a8;
                if ((float)ws - cursor_local->w <= local_a8) {
                  local_a0 = (float)ws - cursor_local->w;
                }
                if (0.0 <= local_a0) {
                  if ((float)ws - cursor_local->w <= local_a8) {
                    local_a8 = (float)ws - cursor_local->w;
                  }
                  local_a4 = local_a8;
                }
                else {
                  local_a4 = 0.0;
                }
                scroll_step_local = local_a4;
              }
            }
            else {
              iVar4 = nk_input_is_key_pressed(pnStack_20,NK_KEY_SCROLL_START);
              if (iVar4 == 0) {
                iVar4 = nk_input_is_key_pressed(pnStack_20,NK_KEY_SCROLL_END);
                if ((iVar4 != 0) && (o == NK_VERTICAL)) {
                  scroll_step_local = (float)ws - cursor_local->h;
                }
              }
              else if (o == NK_VERTICAL) {
                scroll_step_local = 0.0;
              }
            }
          }
        }
        else if (o == NK_VERTICAL) {
          if ((float)ws - cursor_local->h <= scroll_step_local + cursor_local->h) {
            local_8c = (float)ws - cursor_local->h;
          }
          else {
            local_8c = scroll_step_local + cursor_local->h;
          }
          scroll_step_local = local_8c;
        }
        else {
          if ((float)ws - cursor_local->w <= scroll_step_local + cursor_local->w) {
            local_90 = (float)ws - cursor_local->w;
          }
          else {
            local_90 = scroll_step_local + cursor_local->w;
          }
          scroll_step_local = local_90;
        }
      }
      else if (o == NK_VERTICAL) {
        if (scroll_step_local - cursor_local->h <= 0.0) {
          local_84 = 0.0;
        }
        else {
          local_84 = scroll_step_local - cursor_local->h;
        }
        scroll_step_local = local_84;
      }
      else {
        if (scroll_step_local - cursor_local->w <= 0.0) {
          local_88 = 0.0;
        }
        else {
          local_88 = scroll_step_local - cursor_local->w;
        }
        scroll_step_local = local_88;
      }
    }
    else {
      (in_local->keyboard).keys[0].down = 0x22;
      if (o == NK_VERTICAL) {
        local_74 = ((pnStack_20->mouse).delta.y / cursor_local->h) * (float)ws;
        if ((float)ws - cursor_local->h <= scroll_step_local + local_74) {
          local_6c = (float)ws - cursor_local->h;
        }
        else {
          local_6c = scroll_step_local + local_74;
        }
        if (0.0 <= local_6c) {
          if ((float)ws - cursor_local->h <= scroll_step_local + local_74) {
            local_74 = (float)ws - cursor_local->h;
          }
          else {
            local_74 = scroll_step_local + local_74;
          }
          local_70 = local_74;
        }
        else {
          local_70 = 0.0;
        }
        scroll_step_local = local_70;
        (pnStack_20->mouse).buttons[0].clicked_pos.y =
             (local_70 / (float)ws) * cursor_local->h + cursor_local->y + empty0_local->h / 2.0;
      }
      else {
        local_80 = ((pnStack_20->mouse).delta.x / cursor_local->w) * (float)ws;
        if ((float)ws - cursor_local->w <= scroll_step_local + local_80) {
          local_78 = (float)ws - cursor_local->w;
        }
        else {
          local_78 = scroll_step_local + local_80;
        }
        if (0.0 <= local_78) {
          if ((float)ws - cursor_local->w <= scroll_step_local + local_80) {
            local_80 = (float)ws - cursor_local->w;
          }
          else {
            local_80 = scroll_step_local + local_80;
          }
          local_7c = local_80;
        }
        else {
          local_7c = 0.0;
        }
        scroll_step_local = local_7c;
        (pnStack_20->mouse).buttons[0].clicked_pos.x =
             (local_7c / (float)ws) * cursor_local->w + cursor_local->x + empty0_local->w / 2.0;
      }
    }
    if ((((in_local->keyboard).keys[0].down & 0x10U) == 0) ||
       (iVar4 = nk_input_is_mouse_prev_hovering_rect(pnStack_20,*cursor_local), iVar4 != 0)) {
      iVar4 = nk_input_is_mouse_prev_hovering_rect(pnStack_20,*cursor_local);
      if (iVar4 != 0) {
        (in_local->keyboard).keys[0].down = (in_local->keyboard).keys[0].down | 0x40;
      }
    }
    else {
      (in_local->keyboard).keys[0].down = (in_local->keyboard).keys[0].down | 8;
    }
    state_local._4_4_ = scroll_step_local;
  }
  return state_local._4_4_;
}

Assistant:

NK_INTERN float
nk_scrollbar_behavior(nk_flags *state, struct nk_input *in,
    int has_scrolling, const struct nk_rect *scroll,
    const struct nk_rect *cursor, const struct nk_rect *empty0,
    const struct nk_rect *empty1, float scroll_offset,
    float target, float scroll_step, enum nk_orientation o)
{
    nk_flags ws;
    int left_mouse_down;
    int left_mouse_click_in_cursor;

    nk_widget_state_reset(state);
    if (!in) return scroll_offset;

    left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
    left_mouse_click_in_cursor = nk_input_has_mouse_click_down_in_rect(in,
        NK_BUTTON_LEFT, *cursor, nk_true);
    if (nk_input_is_mouse_hovering_rect(in, *scroll))
        *state = NK_WIDGET_STATE_HOVERED;

    if (left_mouse_down && left_mouse_click_in_cursor) {
        /* update cursor by mouse dragging */
        float pixel, delta;
        *state = NK_WIDGET_STATE_ACTIVE;
        if (o == NK_VERTICAL) {
            float cursor_y;
            pixel = in->mouse.delta.y;
            delta = (pixel / scroll->h) * target;
            scroll_offset = NK_CLAMP(0, scroll_offset + delta, target - scroll->h);
            cursor_y = scroll->y + ((scroll_offset/target) * scroll->h);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y = cursor_y + cursor->h/2.0f;
        } else {
            float cursor_x;
            pixel = in->mouse.delta.x;
            delta = (pixel / scroll->w) * target;
            scroll_offset = NK_CLAMP(0, scroll_offset + delta, target - scroll->w);
            cursor_x = scroll->x + ((scroll_offset/target) * scroll->w);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x = cursor_x + cursor->w/2.0f;
        }
    } else if ((nk_input_is_key_pressed(in, NK_KEY_SCROLL_UP) && o == NK_VERTICAL && has_scrolling)||
            nk_button_behavior(&ws, *empty0, in, NK_BUTTON_DEFAULT)) {
        /* scroll page up by click on empty space or shortcut */
        if (o == NK_VERTICAL)
            scroll_offset = NK_MAX(0, scroll_offset - scroll->h);
        else scroll_offset = NK_MAX(0, scroll_offset - scroll->w);
    } else if ((nk_input_is_key_pressed(in, NK_KEY_SCROLL_DOWN) && o == NK_VERTICAL && has_scrolling) ||
        nk_button_behavior(&ws, *empty1, in, NK_BUTTON_DEFAULT)) {
        /* scroll page down by click on empty space or shortcut */
        if (o == NK_VERTICAL)
            scroll_offset = NK_MIN(scroll_offset + scroll->h, target - scroll->h);
        else scroll_offset = NK_MIN(scroll_offset + scroll->w, target - scroll->w);
    } else if (has_scrolling) {
        if ((in->mouse.scroll_delta<0 || (in->mouse.scroll_delta>0))) {
            /* update cursor by mouse scrolling */
            scroll_offset = scroll_offset + scroll_step * (-in->mouse.scroll_delta);
            if (o == NK_VERTICAL)
                scroll_offset = NK_CLAMP(0, scroll_offset, target - scroll->h);
            else scroll_offset = NK_CLAMP(0, scroll_offset, target - scroll->w);
        } else if (nk_input_is_key_pressed(in, NK_KEY_SCROLL_START)) {
            /* update cursor to the beginning  */
            if (o == NK_VERTICAL) scroll_offset = 0;
        } else if (nk_input_is_key_pressed(in, NK_KEY_SCROLL_END)) {
            /* update cursor to the end */
            if (o == NK_VERTICAL) scroll_offset = target - scroll->h;
        }
    }
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(in, *scroll))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(in, *scroll))
        *state |= NK_WIDGET_STATE_LEFT;
    return scroll_offset;
}